

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

void ecpSubAJ(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  size_t n;
  
  n = ec->f->n;
  wwCopy((word *)stack,b,n);
  zzNegMod((word *)((long)stack + n * 8),b + n,ec->f->mod,ec->f->n);
  ecpAddAJ(c,a,(word *)stack,ec,(void *)(n * 0x10 + (long)stack));
  return;
}

Assistant:

static void ecpSubAJ(word c[], const word a[], const word b[], const ec_o* ec,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t = (word*)stack;
	stack = t + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(ecpSeemsOnA(b, ec));
	ASSERT(wwIsSameOrDisjoint(a,  c, 3 * n));
	ASSERT(b == c || wwIsDisjoint2(b, 2 * n, c, 3 * n));
	// t <- -b
	qrCopy(ecX(t), ecX(b), ec->f);
	zmNeg(ecY(t, n), ecY(b, n), ec->f);
	// c <- a + t
	ecpAddAJ(c, a, t, ec, stack);
}